

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.cpp
# Opt level: O1

Vector3d * __thiscall
OpenMD::VelocityField::getValue
          (Vector3d *__return_storage_ptr__,VelocityField *this,StuntDouble *sd)

{
  Vector3d *pVVar1;
  long lVar2;
  
  pVVar1 = (Vector3d *)
           ((long)sd->localIndex_ * 0x18 +
           *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).velocity.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + sd->storage_));
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[0] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[1] = 0.0;
  (__return_storage_ptr__->super_Vector<double,_3U>).data_[2] = 0.0;
  if (pVVar1 != __return_storage_ptr__) {
    lVar2 = 0;
    do {
      (__return_storage_ptr__->super_Vector<double,_3U>).data_[lVar2] =
           (pVVar1->super_Vector<double,_3U>).data_[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector3d VelocityField::getValue(StuntDouble* sd) { return sd->getVel(); }